

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  uint *workSpace_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_t _var_err__;
  uint *count;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  BYTE *pBVar9;
  byte bVar10;
  HUF_CElt *pHVar11;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  int in_stack_ffffffffffffff90;
  uint local_64;
  BYTE *local_60;
  BYTE *local_58;
  HUF_CElt *local_50;
  BYTE *local_48;
  uint *local_40;
  uint local_38;
  uint local_34;
  
  local_64 = maxSymbolValue;
  local_60 = (BYTE *)dst;
  local_58 = (BYTE *)src;
  count = (uint *)HUF_alignUpWorkspace(workSpace,&wkspSize,8);
  pBVar9 = local_58;
  if (wkspSize < 0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  sVar8 = 0xffffffffffffffd2;
  if (0xff < local_64) {
    return 0xffffffffffffffd2;
  }
  if (local_64 == 0) {
    local_64 = 0xff;
  }
  uVar3 = 0xb;
  if (huffLog != 0) {
    uVar3 = huffLog;
  }
  local_48 = local_60 + dstSize;
  bVar10 = repeat != (HUF_repeat *)0x0 & (byte)((flags & 4U) >> 2);
  if ((bVar10 == 1) && (*repeat == HUF_repeat_valid)) {
    sVar8 = HUF_compressCTable_internal
                      (local_60,local_60,local_48,local_58,srcSize,nbStreams,oldHufTable,
                       in_stack_ffffffffffffff90);
    return sVar8;
  }
  local_40 = (uint *)CONCAT44(local_40._4_4_,uVar3);
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    local_34 = local_64;
    uVar3 = HIST_count_simple(count,&local_34,local_58,0x1000);
    sVar8 = (size_t)uVar3;
    local_38 = local_64;
    uVar3 = HIST_count_simple(count,&local_38,pBVar9 + (srcSize - 0x1000),0x1000);
    if (uVar3 + sVar8 < 0x45) {
      return 0;
    }
  }
  workSpace_00 = count + 0x302;
  sVar4 = HIST_count_wksp(count,&local_64,local_58,srcSize,workSpace_00,0x1000);
  if (sVar4 < 0xffffffffffffff89) {
    if (sVar4 == srcSize) {
      *local_60 = *local_58;
      bVar2 = false;
      sVar4 = 1;
    }
    else {
      uVar5 = (srcSize >> 7) + 4;
      bVar2 = uVar5 < sVar4;
      bVar1 = sVar4 <= uVar5;
      sVar4 = sVar8;
      if (bVar1) {
        sVar4 = 0;
      }
    }
  }
  else {
    bVar2 = false;
  }
  if (!bVar2) {
    return sVar4;
  }
  if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) && (-1 < (int)local_64)) {
    lVar6 = 0;
    bVar2 = false;
    do {
      bVar2 = (bool)(bVar2 | ((char)oldHufTable[lVar6 + 1] == '\0' && count[lVar6] != 0));
      lVar6 = lVar6 + 1;
    } while ((ulong)local_64 + 1 != lVar6);
    if (bVar2) {
      *repeat = HUF_repeat_none;
    }
  }
  if ((bVar10 != 0) && (pBVar9 = local_60, pHVar11 = oldHufTable, *repeat != HUF_repeat_none))
  goto LAB_0084f879;
  pHVar11 = (HUF_CElt *)(count + 0x100);
  in_stack_ffffffffffffff90 = flags;
  uVar3 = HUF_optimalTableLog((uint)local_40,srcSize,local_64,workSpace_00,0x1300,pHVar11,count,
                              flags);
  local_40 = workSpace_00;
  sVar8 = HUF_buildCTable_wksp(pHVar11,count,local_64,uVar3,workSpace_00,0x1300);
  if (0xffffffffffffff88 < sVar8) {
    return sVar8;
  }
  memset(pHVar11 + (local_64 + 2),0,(ulong)(local_64 + 2) * -8 + 0x808);
  pBVar9 = local_60;
  local_50 = pHVar11;
  sVar8 = HUF_writeCTable_wksp(local_60,dstSize,pHVar11,local_64,(uint)sVar8,local_40,0x2ec);
  pHVar11 = local_50;
  if (sVar8 < 0xffffffffffffff89) {
    if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
      if ((int)local_64 < 0) {
        uVar5 = 0;
      }
      else {
        lVar6 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 + (ulong)count[lVar6] * (ulong)(byte)oldHufTable[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while ((ulong)local_64 + 1 != lVar6);
        uVar5 = uVar5 >> 3;
      }
      if ((int)local_64 < 0) {
        uVar7 = 0;
      }
      else {
        lVar6 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 + (ulong)count[lVar6] * (ulong)(byte)count[lVar6 * 2 + 0x102];
          lVar6 = lVar6 + 1;
        } while ((ulong)local_64 + 1 != lVar6);
        uVar7 = uVar7 >> 3;
      }
      if (srcSize <= sVar8 + 0xc || uVar5 <= uVar7 + sVar8) {
        sVar4 = HUF_compressCTable_internal
                          (local_60,local_60,local_48,local_58,srcSize,nbStreams,oldHufTable,
                           in_stack_ffffffffffffff90);
        bVar2 = false;
        pBVar9 = local_60;
        pHVar11 = local_50;
        goto LAB_0084f868;
      }
    }
    if (sVar8 + 0xc < srcSize) {
      if (repeat != (HUF_repeat *)0x0) {
        *repeat = HUF_repeat_none;
      }
      pBVar9 = local_60 + sVar8;
      bVar2 = true;
      if (oldHufTable != (HUF_CElt *)0x0) {
        memcpy(oldHufTable,local_50,0x808);
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
      sVar4 = 0;
      pBVar9 = local_60;
    }
  }
  else {
    bVar2 = false;
    sVar4 = sVar8;
  }
LAB_0084f868:
  if (!bVar2) {
    return sVar4;
  }
LAB_0084f879:
  sVar8 = HUF_compressCTable_internal
                    (local_60,pBVar9,local_48,local_58,srcSize,nbStreams,pHVar11,
                     in_stack_ffffffffffffff90);
  return sVar8;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}